

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_model(Net *this,DataReader *dr)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppLVar4;
  undefined8 uVar5;
  void *pvVar6;
  long in_RDI;
  int cret;
  Option opt1;
  int lret;
  Layer *layer;
  int i;
  ModelBinFromDataReader mb;
  int ret;
  int layer_count;
  undefined8 in_stack_ffffffffffffff28;
  PoolAllocator *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff44;
  DataReader *in_stack_ffffffffffffff48;
  FILE *pFVar8;
  uint in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined1 local_98 [84];
  int local_44;
  value_type local_40;
  uint local_34;
  undefined1 local_30 [16];
  int local_20;
  int local_1c;
  int local_4;
  
  bVar1 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::empty
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (bVar1) {
    fprintf(_stderr,"network graph not ready");
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  else {
    sVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       (*(long *)(in_RDI + 0x48) + 0x20));
    local_1c = (int)sVar3;
    local_20 = 0;
    ModelBinFromDataReader::ModelBinFromDataReader
              ((ModelBinFromDataReader *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    for (local_34 = 0; (int)local_34 < local_1c; local_34 = local_34 + 1) {
      ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                           (*(long *)(in_RDI + 0x48) + 0x20),(long)(int)local_34);
      local_40 = *ppLVar4;
      if (local_40 == (value_type)0x0) {
        fprintf(_stderr,"load_model error at layer %d, parameter file has inconsistent content.",
                (ulong)local_34);
        fprintf(_stderr,"\n");
        local_20 = -1;
        break;
      }
      in_stack_ffffffffffffff54 = (*local_40->_vptr_Layer[3])(local_40,local_30);
      local_44 = in_stack_ffffffffffffff54;
      if (in_stack_ffffffffffffff54 != 0) {
        pFVar8 = _stderr;
        in_stack_ffffffffffffff50 = local_34;
        uVar5 = std::__cxx11::string::c_str();
        fprintf(pFVar8,"layer load_model %d %s failed",(ulong)in_stack_ffffffffffffff50,uVar5);
        fprintf(_stderr,"\n");
        local_20 = -1;
        break;
      }
      get_masked_option((Option *)(ulong)in_stack_ffffffffffffff50,
                        (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      iVar2 = (*local_40->_vptr_Layer[4])(local_40,local_98);
      pFVar8 = _stderr;
      if (iVar2 != 0) {
        uVar7 = local_34;
        uVar5 = std::__cxx11::string::c_str();
        fprintf(pFVar8,"layer create_pipeline %d %s failed",(ulong)uVar7,uVar5);
        fprintf(_stderr,"\n");
        local_20 = -1;
        break;
      }
    }
    if ((*(byte *)(in_RDI + 0x3c) & 1) != 0) {
      if ((*(long *)(in_RDI + 0x10) == 0) && (*(long *)(*(long *)(in_RDI + 0x48) + 200) == 0)) {
        in_stack_ffffffffffffff30 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator
                  ((PoolAllocator *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        *(PoolAllocator **)(*(long *)(in_RDI + 0x48) + 200) = in_stack_ffffffffffffff30;
        PoolAllocator::set_size_compare_ratio
                  (in_stack_ffffffffffffff30,(float)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      }
      if ((*(long *)(in_RDI + 0x18) == 0) && (*(long *)(*(long *)(in_RDI + 0x48) + 0xd0) == 0)) {
        pvVar6 = operator_new(0x10);
        PoolAllocator::PoolAllocator
                  ((PoolAllocator *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        *(void **)(*(long *)(in_RDI + 0x48) + 0xd0) = pvVar6;
        PoolAllocator::set_size_compare_ratio
                  (in_stack_ffffffffffffff30,(float)((ulong)pvVar6 >> 0x20));
      }
    }
    local_4 = local_20;
    ModelBinFromDataReader::~ModelBinFromDataReader
              ((ModelBinFromDataReader *)in_stack_ffffffffffffff30);
  }
  return local_4;
}

Assistant:

int Net::load_model(const DataReader& dr)
{
    if (d->layers.empty())
    {
        NCNN_LOGE("network graph not ready");
        return -1;
    }

    int layer_count = (int)d->layers.size();

    // load file
    int ret = 0;

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!opt.pipeline_cache)
        {
            if (!d->pipeline_cache)
                d->pipeline_cache = new PipelineCache(d->vkdev);
            opt.pipeline_cache = d->pipeline_cache;
        }
    }
#endif // NCNN_VULKAN

    ModelBinFromDataReader mb(dr);
    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        //Here we found inconsistent content in the parameter file.
        if (!layer)
        {
            NCNN_LOGE("load_model error at layer %d, parameter file has inconsistent content.", i);
            ret = -1;
            break;
        }

        int lret = layer->load_model(mb);
        if (lret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_model %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_model %d failed", i);
#endif
            ret = -1;
            break;
        }

        Option opt1 = get_masked_option(opt, layer->featmask);

        int cret = layer->create_pipeline(opt1);
        if (cret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer create_pipeline %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer create_pipeline %d failed", i);
#endif
            ret = -1;
            break;
        }
    }

    if (opt.use_local_pool_allocator)
    {
        if (opt.blob_allocator == 0)
        {
            if (!d->local_blob_allocator)
            {
                d->local_blob_allocator = new PoolAllocator;
                d->local_blob_allocator->set_size_compare_ratio(0.f);
            }
        }
        if (opt.workspace_allocator == 0)
        {
            if (!d->local_workspace_allocator)
            {
                d->local_workspace_allocator = new PoolAllocator;
                d->local_workspace_allocator->set_size_compare_ratio(0.f);
            }
        }
    }

#if NCNN_VULKAN
    if (ret == 0 && opt.use_vulkan_compute)
    {
        ret = d->upload_model();
    }
#endif // NCNN_VULKAN

    return ret;
}